

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

char * __thiscall deqp::sl::ShaderParser::getTokenName(ShaderParser *this,Token token)

{
  Token token_local;
  ShaderParser *this_local;
  
  switch(token) {
  case TOKEN_INVALID:
    this_local = (ShaderParser *)anon_var_dwarf_95e39a;
    break;
  case TOKEN_EOF:
    this_local = (ShaderParser *)anon_var_dwarf_95e3b1;
    break;
  case TOKEN_STRING:
    this_local = (ShaderParser *)anon_var_dwarf_95e3bc;
    break;
  case TOKEN_SHADER_SOURCE:
    this_local = (ShaderParser *)0x2adc55c;
    break;
  case TOKEN_INT_LITERAL:
    this_local = (ShaderParser *)anon_var_dwarf_95e3d2;
    break;
  case TOKEN_FLOAT_LITERAL:
    this_local = (ShaderParser *)anon_var_dwarf_95e3dd;
    break;
  case TOKEN_IDENTIFIER:
    this_local = (ShaderParser *)anon_var_dwarf_95e3e8;
    break;
  case TOKEN_TRUE:
    this_local = (ShaderParser *)0x2be5d0c;
    break;
  case TOKEN_FALSE:
    this_local = (ShaderParser *)0x2c79a83;
    break;
  case TOKEN_DESC:
    this_local = (ShaderParser *)anon_var_dwarf_2852fd;
    break;
  case TOKEN_EXPECT:
    this_local = (ShaderParser *)anon_var_dwarf_9551ea;
    break;
  case TOKEN_GROUP:
    this_local = (ShaderParser *)0x2bd9a60;
    break;
  case TOKEN_CASE:
    this_local = (ShaderParser *)0x29bf3a1;
    break;
  case TOKEN_END:
    this_local = (ShaderParser *)0x2b5ba08;
    break;
  case TOKEN_VALUES:
    this_local = (ShaderParser *)0x2ac79a4;
    break;
  case TOKEN_BOTH:
    this_local = (ShaderParser *)0x2bf9fdd;
    break;
  case TOKEN_VERTEX:
    this_local = (ShaderParser *)0x2ad969f;
    break;
  case TOKEN_FRAGMENT:
    this_local = (ShaderParser *)0x2c169f8;
    break;
  case TOKEN_UNIFORM:
    this_local = (ShaderParser *)0x2acd11d;
    break;
  case TOKEN_INPUT:
    this_local = (ShaderParser *)0x2a642a9;
    break;
  case TOKEN_OUTPUT:
    this_local = (ShaderParser *)0x2c2e607;
    break;
  case TOKEN_FLOAT:
    this_local = (ShaderParser *)0x2a7e3b8;
    break;
  case TOKEN_FLOAT_VEC2:
    this_local = (ShaderParser *)0x2ad4d64;
    break;
  case TOKEN_FLOAT_VEC3:
    this_local = (ShaderParser *)0x2ad4d83;
    break;
  case TOKEN_FLOAT_VEC4:
    this_local = (ShaderParser *)0x2ad4da2;
    break;
  case TOKEN_FLOAT_MAT2:
    this_local = (ShaderParser *)0x2b32368;
    break;
  case TOKEN_FLOAT_MAT2X3:
    this_local = (ShaderParser *)0x2b3236f;
    break;
  case TOKEN_FLOAT_MAT2X4:
    this_local = (ShaderParser *)0x2b32378;
    break;
  case TOKEN_FLOAT_MAT3X2:
    this_local = (ShaderParser *)0x2b32381;
    break;
  case TOKEN_FLOAT_MAT3:
    this_local = (ShaderParser *)0x2b3238a;
    break;
  case TOKEN_FLOAT_MAT3X4:
    this_local = (ShaderParser *)0x2b32391;
    break;
  case TOKEN_FLOAT_MAT4X2:
    this_local = (ShaderParser *)0x2b3239a;
    break;
  case TOKEN_FLOAT_MAT4X3:
    this_local = (ShaderParser *)0x2b323a3;
    break;
  case TOKEN_FLOAT_MAT4:
    this_local = (ShaderParser *)0x2b323ac;
    break;
  case TOKEN_INT:
    this_local = (ShaderParser *)0x2bf05b0;
    break;
  case TOKEN_INT_VEC2:
    this_local = (ShaderParser *)0x2c2bf81;
    break;
  case TOKEN_INT_VEC3:
    this_local = (ShaderParser *)0x29ef6e3;
    break;
  case TOKEN_INT_VEC4:
    this_local = (ShaderParser *)0x2af1fc0;
    break;
  case TOKEN_UINT:
    this_local = (ShaderParser *)0x2a49c1b;
    break;
  case TOKEN_UINT_VEC2:
    this_local = (ShaderParser *)0x29ef741;
    break;
  case TOKEN_UINT_VEC3:
    this_local = (ShaderParser *)0x29ef761;
    break;
  case TOKEN_UINT_VEC4:
    this_local = (ShaderParser *)0x2bf495f;
    break;
  case TOKEN_BOOL:
    this_local = (ShaderParser *)0x29ef44e;
    break;
  case TOKEN_BOOL_VEC2:
    this_local = (ShaderParser *)0x2b989b6;
    break;
  case TOKEN_BOOL_VEC3:
    this_local = (ShaderParser *)0x2b989ed;
    break;
  case TOKEN_BOOL_VEC4:
    this_local = (ShaderParser *)0x2b98a24;
    break;
  default:
    this_local = (ShaderParser *)anon_var_dwarf_95e3ff;
    break;
  case TOKEN_ASSIGN:
    this_local = (ShaderParser *)0x2a970fd;
    break;
  case TOKEN_PLUS:
    this_local = (ShaderParser *)0x2bd29c9;
    break;
  case TOKEN_MINUS:
    this_local = (ShaderParser *)0x2a270ca;
    break;
  case TOKEN_COMMA:
    this_local = (ShaderParser *)0x2c5c975;
    break;
  case TOKEN_VERTICAL_BAR:
    this_local = (ShaderParser *)0x2a430a7;
    break;
  case TOKEN_SEMI_COLON:
    this_local = (ShaderParser *)0x2b6f38d;
    break;
  case TOKEN_LEFT_PAREN:
    this_local = (ShaderParser *)0x2afcbef;
    break;
  case TOKEN_RIGHT_PAREN:
    this_local = (ShaderParser *)0x2a85ff4;
    break;
  case TOKEN_LEFT_BRACKET:
    this_local = (ShaderParser *)0x2c316fc;
    break;
  case TOKEN_RIGHT_BRACKET:
    this_local = (ShaderParser *)0x29dc08e;
    break;
  case TOKEN_LEFT_BRACE:
    this_local = (ShaderParser *)0x2b6f774;
    break;
  case TOKEN_RIGHT_BRACE:
    this_local = (ShaderParser *)0x2b6f7db;
  }
  return (char *)this_local;
}

Assistant:

const char* ShaderParser::getTokenName(Token token)
{
	switch (token)
	{
	case TOKEN_INVALID:
		return "<invalid>";
	case TOKEN_EOF:
		return "<eof>";
	case TOKEN_STRING:
		return "<string>";
	case TOKEN_SHADER_SOURCE:
		return "source";

	case TOKEN_INT_LITERAL:
		return "<int>";
	case TOKEN_FLOAT_LITERAL:
		return "<float>";

	// identifiers
	case TOKEN_IDENTIFIER:
		return "<identifier>";
	case TOKEN_TRUE:
		return "true";
	case TOKEN_FALSE:
		return "false";
	case TOKEN_DESC:
		return "desc";
	case TOKEN_EXPECT:
		return "expect";
	case TOKEN_GROUP:
		return "group";
	case TOKEN_CASE:
		return "case";
	case TOKEN_END:
		return "end";
	case TOKEN_VALUES:
		return "values";
	case TOKEN_BOTH:
		return "both";
	case TOKEN_VERTEX:
		return "vertex";
	case TOKEN_FRAGMENT:
		return "fragment";
	case TOKEN_UNIFORM:
		return "uniform";
	case TOKEN_INPUT:
		return "input";
	case TOKEN_OUTPUT:
		return "output";
	case TOKEN_FLOAT:
		return "float";
	case TOKEN_FLOAT_VEC2:
		return "vec2";
	case TOKEN_FLOAT_VEC3:
		return "vec3";
	case TOKEN_FLOAT_VEC4:
		return "vec4";
	case TOKEN_FLOAT_MAT2:
		return "mat2";
	case TOKEN_FLOAT_MAT2X3:
		return "mat2x3";
	case TOKEN_FLOAT_MAT2X4:
		return "mat2x4";
	case TOKEN_FLOAT_MAT3X2:
		return "mat3x2";
	case TOKEN_FLOAT_MAT3:
		return "mat3";
	case TOKEN_FLOAT_MAT3X4:
		return "mat3x4";
	case TOKEN_FLOAT_MAT4X2:
		return "mat4x2";
	case TOKEN_FLOAT_MAT4X3:
		return "mat4x3";
	case TOKEN_FLOAT_MAT4:
		return "mat4";
	case TOKEN_INT:
		return "int";
	case TOKEN_INT_VEC2:
		return "ivec2";
	case TOKEN_INT_VEC3:
		return "ivec3";
	case TOKEN_INT_VEC4:
		return "ivec4";
	case TOKEN_UINT:
		return "uint";
	case TOKEN_UINT_VEC2:
		return "uvec2";
	case TOKEN_UINT_VEC3:
		return "uvec3";
	case TOKEN_UINT_VEC4:
		return "uvec4";
	case TOKEN_BOOL:
		return "bool";
	case TOKEN_BOOL_VEC2:
		return "bvec2";
	case TOKEN_BOOL_VEC3:
		return "bvec3";
	case TOKEN_BOOL_VEC4:
		return "bvec4";

	case TOKEN_ASSIGN:
		return "=";
	case TOKEN_PLUS:
		return "+";
	case TOKEN_MINUS:
		return "-";
	case TOKEN_COMMA:
		return ",";
	case TOKEN_VERTICAL_BAR:
		return "|";
	case TOKEN_SEMI_COLON:
		return ";";
	case TOKEN_LEFT_PAREN:
		return "(";
	case TOKEN_RIGHT_PAREN:
		return ")";
	case TOKEN_LEFT_BRACKET:
		return "[";
	case TOKEN_RIGHT_BRACKET:
		return "]";
	case TOKEN_LEFT_BRACE:
		return "{";
	case TOKEN_RIGHT_BRACE:
		return "}";

	default:
		return "<unknown>";
	}
}